

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int xmlRegExecPushString2(xmlRegExecCtxtPtr exec,xmlChar *value,xmlChar *value2,void *data)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int *local_e0;
  xmlChar *str;
  int ret;
  int lenp;
  int lenn;
  xmlChar buf [150];
  void *data_local;
  xmlChar *value2_local;
  xmlChar *value_local;
  xmlRegExecCtxtPtr exec_local;
  
  if (exec == (xmlRegExecCtxtPtr)0x0) {
    exec_local._4_4_ = -1;
  }
  else if (exec->comp == (xmlRegexpPtr)0x0) {
    exec_local._4_4_ = -1;
  }
  else if (exec->status == 0) {
    unique0x1000013b = data;
    if (value2 == (xmlChar *)0x0) {
      exec_local._4_4_ = xmlRegExecPushString(exec,value,data);
    }
    else {
      sVar3 = strlen((char *)value2);
      iVar1 = (int)sVar3;
      sVar3 = strlen((char *)value);
      iVar2 = (int)sVar3;
      if (iVar1 + iVar2 + 2 < 0x97) {
        local_e0 = &lenp;
      }
      else {
        local_e0 = (int *)(*xmlMalloc)((long)(iVar1 + iVar2 + 2));
        if (local_e0 == (int *)0x0) {
          exec->status = -5;
          return -1;
        }
      }
      memcpy(local_e0,value,(long)iVar2);
      *(undefined1 *)((long)local_e0 + (long)iVar2) = 0x7c;
      memcpy((void *)((long)local_e0 + (long)(iVar2 + 1)),value2,(long)iVar1);
      *(undefined1 *)((long)local_e0 + (long)(iVar1 + iVar2 + 1)) = 0;
      if (exec->comp->compact == (int *)0x0) {
        str._4_4_ = xmlRegExecPushStringInternal(exec,(xmlChar *)local_e0,stack0xffffffffffffffd0,1)
        ;
      }
      else {
        str._4_4_ = xmlRegCompactPushString
                              (exec,exec->comp,(xmlChar *)local_e0,stack0xffffffffffffffd0);
      }
      if (local_e0 != &lenp) {
        (*xmlFree)(local_e0);
      }
      exec_local._4_4_ = str._4_4_;
    }
  }
  else {
    exec_local._4_4_ = exec->status;
  }
  return exec_local._4_4_;
}

Assistant:

int
xmlRegExecPushString2(xmlRegExecCtxtPtr exec, const xmlChar *value,
                      const xmlChar *value2, void *data) {
    xmlChar buf[150];
    int lenn, lenp, ret;
    xmlChar *str;

    if (exec == NULL)
	return(-1);
    if (exec->comp == NULL)
	return(-1);
    if (exec->status != XML_REGEXP_OK)
	return(exec->status);

    if (value2 == NULL)
        return(xmlRegExecPushString(exec, value, data));

    lenn = strlen((char *) value2);
    lenp = strlen((char *) value);

    if (150 < lenn + lenp + 2) {
	str = xmlMalloc(lenn + lenp + 2);
	if (str == NULL) {
	    exec->status = XML_REGEXP_OUT_OF_MEMORY;
	    return(-1);
	}
    } else {
	str = buf;
    }
    memcpy(&str[0], value, lenp);
    str[lenp] = XML_REG_STRING_SEPARATOR;
    memcpy(&str[lenp + 1], value2, lenn);
    str[lenn + lenp + 1] = 0;

    if (exec->comp->compact != NULL)
	ret = xmlRegCompactPushString(exec, exec->comp, str, data);
    else
        ret = xmlRegExecPushStringInternal(exec, str, data, 1);

    if (str != buf)
        xmlFree(str);
    return(ret);
}